

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringBuilder.cpp
# Opt level: O3

void __thiscall
Js::JSONStringBuilder::EscapeAndAppendString(JSONStringBuilder *this,JavascriptString *str)

{
  char16 *pcVar1;
  char16 *pcVar2;
  charcount_t cVar3;
  char16 *pcVar4;
  char16 character;
  
  cVar3 = JavascriptString::GetLength(str);
  AppendCharacter(this,L'\"');
  pcVar4 = JavascriptString::GetString(str);
  pcVar2 = pcVar4 + cVar3;
  do {
    if (pcVar2 <= pcVar4) {
      AppendCharacter(this,L'\"');
      return;
    }
    character = *pcVar4;
    switch(character) {
    case L'\b':
      AppendCharacter(this,L'\\');
      character = L'b';
      break;
    case L'\t':
      AppendCharacter(this,L'\\');
      character = L't';
      break;
    case L'\n':
      AppendCharacter(this,L'\\');
      character = L'n';
      break;
    case L'\v':
switchD_00b64c75_caseD_b:
      if (0x1f < (ushort)character) {
        if ((character & 0xfc00U) == 0xd800) {
          pcVar1 = pcVar4 + 1;
          if ((pcVar2 <= pcVar1) || ((*pcVar1 & 0xfc00U) != 0xdc00)) goto LAB_00b64d79;
          AppendCharacter(this,character);
          character = *pcVar1;
          pcVar4 = pcVar1;
        }
        else if ((character & 0xfc00U) == 0xdc00) goto LAB_00b64d79;
        break;
      }
LAB_00b64d79:
      AppendEscapeSequence(this,character);
      goto LAB_00b64d3b;
    case L'\f':
      AppendCharacter(this,L'\\');
      character = L'f';
      break;
    case L'\r':
      AppendCharacter(this,L'\\');
      character = L'r';
      break;
    default:
      if ((character != L'\\') && (character != L'\"')) goto switchD_00b64c75_caseD_b;
      AppendCharacter(this,L'\\');
    }
    AppendCharacter(this,character);
LAB_00b64d3b:
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

void
JSONStringBuilder::EscapeAndAppendString(_In_ JavascriptString* str)
{
    const charcount_t strLength = str->GetLength();

    // Strings should be surrounded by double quotes
    this->AppendCharacter(_u('"'));
    const char16* bufferStart = str->GetString();
    for (const char16* index = bufferStart; index < bufferStart + strLength; ++index)
    {
        char16 currentCharacter = *index;
        switch (currentCharacter)
        {
        case _u('"'):
        case _u('\\'):
            // Special characters are escaped with a backslash
            this->AppendCharacter(_u('\\'));
            this->AppendCharacter(currentCharacter);
            break;
        case _u('\b'):
            this->AppendCharacter(_u('\\'));
            this->AppendCharacter(_u('b'));
            break;
        case _u('\f'):
            this->AppendCharacter(_u('\\'));
            this->AppendCharacter(_u('f'));
            break;
        case _u('\n'):
            this->AppendCharacter(_u('\\'));
            this->AppendCharacter(_u('n'));
            break;
        case _u('\r'):
            this->AppendCharacter(_u('\\'));
            this->AppendCharacter(_u('r'));
            break;
        case _u('\t'):
            this->AppendCharacter(_u('\\'));
            this->AppendCharacter(_u('t'));
            break;
        default:
            if (currentCharacter < _u(' ') || utf8::IsLowSurrogateChar(currentCharacter))
            {
                this->AppendEscapeSequence(currentCharacter);
            }
            else if (utf8::IsHighSurrogateChar(currentCharacter))
            {
                if (index + 1 < bufferStart + strLength && utf8::IsLowSurrogateChar(*(index + 1)))
                {
                    // Append surrogate pair normally
                    this->AppendCharacter(currentCharacter);
                    this->AppendCharacter(*(index + 1));

                    // Skip the trailing-surrogate code unit
                    index++;
                }
                else
                {
                    // High-surrogate code unit not followed by a trailing-surrogate code unit should be escaped.
                    this->AppendEscapeSequence(currentCharacter);
                }
            }
            else
            {
                this->AppendCharacter(currentCharacter);
            }
            break;
        }
    }

    this->AppendCharacter(_u('"'));
}